

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O3

ostream * operator<<(ostream *out,Matrix *matrix)

{
  int iVar1;
  ostream *poVar2;
  int iVar3;
  long lVar4;
  char local_29;
  
  lVar4 = *(long *)out;
  *(undefined8 *)(out + *(long *)(lVar4 + -0x18) + 0x10) = 8;
  *(undefined8 *)(out + *(long *)(lVar4 + -0x18) + 8) = 4;
  if (0 < matrix->rows) {
    iVar3 = 0;
    do {
      iVar1 = matrix->cols;
      if (0 < iVar1) {
        lVar4 = 0;
        do {
          *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = 8;
          poVar2 = std::ostream::_M_insert<double>(matrix->data[iVar1 * iVar3 + lVar4]);
          local_29 = ' ';
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_29,1);
          iVar1 = matrix->cols;
          lVar4 = lVar4 + 1;
        } while ((int)lVar4 < iVar1);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + (char)out);
      std::ostream::put((char)out);
      std::ostream::flush();
      iVar3 = iVar3 + 1;
    } while (iVar3 < matrix->rows);
  }
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const Matrix& matrix)
{
    out << std::setw(8) << std::setprecision(4);
    for (int i = 0; i < matrix.rows; i++)
    {
        for (int j = 0; j < matrix.cols; j++)
        {
            out << std::setw(8) << matrix(i, j) << ' ';
        }
        out << std::endl;
    }

    return out;
}